

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,Var *var)

{
  Var *var_local;
  DebugInfoVisitor *this_local;
  
  add_info(this,var);
  return;
}

Assistant:

void visit(Var *var) override { add_info(var); }